

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

bool __thiscall
crnlib::
hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
::insert_no_grow(hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
                 *this,insert_result *result,vec<16U,_float> *k,uint *v)

{
  ulong uVar1;
  long lVar2;
  float fVar3;
  raw_node *prVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  bool bVar14;
  uint32 uVar15;
  raw_node *prVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar15 = fast_hash(k,0x40);
  uVar17 = uVar15 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
  prVar4 = (this->m_values).m_p;
  prVar16 = prVar4 + uVar17;
  uVar18 = uVar17;
  if (prVar16->m_bits[0x44] != '\0') {
    fVar3 = k->m_s[0];
    if ((*(float *)prVar16->m_bits == fVar3) && (!NAN(*(float *)prVar16->m_bits) && !NAN(fVar3))) {
      uVar19 = 0xffffffffffffffff;
      do {
        if (uVar19 == 0xe) goto LAB_001894e4;
        lVar2 = uVar19 * 4;
        uVar1 = uVar19 + 1;
        lVar13 = uVar19 + 2;
      } while ((*(float *)(prVar4[uVar17].m_bits + lVar2 + 8) == k->m_s[lVar13]) &&
              (uVar19 = uVar1,
              !NAN(*(float *)(prVar4[uVar17].m_bits + lVar2 + 8)) && !NAN(k->m_s[lVar13])));
      if (0xe < uVar1) {
LAB_001894e4:
        bVar14 = false;
        goto LAB_00189530;
      }
    }
    uVar20 = (this->m_values).m_size - 1;
    uVar19 = (ulong)(uVar17 - 1);
    if (uVar17 == 0) {
      uVar19 = (ulong)uVar20;
    }
    if (uVar17 == (uint)uVar19) {
      return false;
    }
    prVar16 = prVar16 + -1;
    if (uVar17 == 0) {
      prVar16 = prVar4 + uVar20;
    }
    while (uVar18 = (uint)uVar19, prVar16->m_bits[0x44] != '\0') {
      if ((*(float *)prVar16->m_bits == fVar3) && (!NAN(*(float *)prVar16->m_bits) && !NAN(fVar3)))
      {
        uVar19 = 0xffffffffffffffff;
        do {
          if (uVar19 == 0xe) goto LAB_001894e8;
          lVar13 = uVar19 * 4;
          uVar1 = uVar19 + 1;
          lVar2 = uVar19 + 2;
        } while ((*(float *)(prVar16->m_bits + lVar13 + 8) == k->m_s[lVar2]) &&
                (uVar19 = uVar1,
                !NAN(*(float *)(prVar16->m_bits + lVar13 + 8)) && !NAN(k->m_s[lVar2])));
        if (0xe < uVar1) {
LAB_001894e8:
          bVar14 = false;
          uVar17 = uVar18;
          goto LAB_00189530;
        }
      }
      uVar5 = uVar18 - 1;
      if (uVar18 == 0) {
        uVar5 = uVar20;
      }
      uVar19 = (ulong)uVar5;
      prVar16 = prVar16 + -1;
      if (uVar18 == 0) {
        prVar16 = prVar4 + uVar20;
      }
      if (uVar17 == uVar5) {
        return false;
      }
    }
  }
  uVar17 = uVar18;
  if (this->m_grow_threshold <= this->m_num_valid) {
    return false;
  }
  uVar6 = *(undefined8 *)k->m_s;
  uVar7 = *(undefined8 *)(k->m_s + 2);
  uVar8 = *(undefined8 *)(k->m_s + 4);
  uVar9 = *(undefined8 *)(k->m_s + 6);
  uVar10 = *(undefined8 *)(k->m_s + 8);
  uVar11 = *(undefined8 *)(k->m_s + 10);
  uVar12 = *(undefined8 *)(k->m_s + 0xe);
  *(undefined8 *)(prVar16->m_bits + 0x30) = *(undefined8 *)(k->m_s + 0xc);
  *(undefined8 *)(prVar16->m_bits + 0x38) = uVar12;
  *(undefined8 *)(prVar16->m_bits + 0x20) = uVar10;
  *(undefined8 *)(prVar16->m_bits + 0x28) = uVar11;
  *(undefined8 *)(prVar16->m_bits + 0x10) = uVar8;
  *(undefined8 *)(prVar16->m_bits + 0x18) = uVar9;
  *(undefined8 *)prVar16->m_bits = uVar6;
  *(undefined8 *)(prVar16->m_bits + 8) = uVar7;
  *(uint *)(prVar16->m_bits + 0x40) = *v;
  prVar16->m_bits[0x44] = '\x01';
  this->m_num_valid = this->m_num_valid + 1;
  bVar14 = true;
LAB_00189530:
  (result->first).m_pTable = this;
  (result->first).m_index = uVar17;
  result->second = bVar14;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value())
        {
            if (!m_values.size())
            {
                return false;
            }

            int index = hash_key(k);
            node* pNode = &get_node(index);

            if (pNode->state)
            {
                if (m_equals(pNode->first, k))
                {
                    result.first = iterator(*this, index);
                    result.second = false;
                    return true;
                }

                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pNode = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pNode--;
                    }

                    if (orig_index == index)
                    {
                        return false;
                    }

                    if (!pNode->state)
                    {
                        break;
                    }

                    if (m_equals(pNode->first, k))
                    {
                        result.first = iterator(*this, index);
                        result.second = false;
                        return true;
                    }
                }
            }

            if (m_num_valid >= m_grow_threshold)
            {
                return false;
            }

            construct_value_type(pNode, k, v);

            pNode->state = cStateValid;

            m_num_valid++;
            CRNLIB_ASSERT(m_num_valid <= m_values.size());

            result.first = iterator(*this, index);
            result.second = true;

            return true;
        }